

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harmonic.cpp
# Opt level: O1

void __thiscall Harmonic::star_map(Harmonic *this)

{
  Vertex *pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  CVertexTrait *pCVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  SolidVertexIterator viter;
  TreeIterator<MeshLib::Vertex> local_138;
  
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_138,&this->_nmesh->m_verts);
  dVar2 = 0.0;
  dVar9 = 0.0;
  dVar7 = 0.0;
  while (local_138.m_finished == false) {
    pVVar1 = (local_138.m_pointer)->data;
    dVar7 = dVar7 + (pVVar1->m_point).v[0];
    dVar9 = dVar9 + (pVVar1->m_point).v[1];
    dVar2 = dVar2 + (pVVar1->m_point).v[2];
    AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_138);
  }
  iVar5 = MeshLib::Solid::numVertices(this->_nmesh);
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_138,&this->_nmesh->m_verts);
  if (local_138.m_finished == false) {
    dVar3 = (double)iVar5;
    do {
      pVVar1 = (local_138.m_pointer)->data;
      dVar8 = (pVVar1->m_point).v[0] - dVar7 / dVar3;
      dVar10 = (pVVar1->m_point).v[1] - dVar9 / dVar3;
      (pVVar1->m_point).v[0] = dVar8;
      (pVVar1->m_point).v[1] = dVar10;
      dVar4 = (pVVar1->m_point).v[2] - dVar2 / dVar3;
      (pVVar1->m_point).v[2] = dVar4;
      dVar4 = ABS(dVar4 * dVar4 + dVar8 * dVar8 + dVar10 * dVar10);
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar8 = (pVVar1->m_point).v[1];
      (pVVar1->m_point).v[0] = (pVVar1->m_point).v[0] / dVar4;
      (pVVar1->m_point).v[1] = dVar8 / dVar4;
      (pVVar1->m_point).v[2] = (pVVar1->m_point).v[2] / dVar4;
      pCVar6 = MeshLib::trait<MeshLib::CVertexTrait,MeshLib::Vertex>(pVVar1);
      dVar4 = (pVVar1->m_point).v[1];
      (pCVar6->c_normal).v[0] = (pVVar1->m_point).v[0];
      (pCVar6->c_normal).v[1] = dVar4;
      (pCVar6->c_normal).v[2] = (pVVar1->m_point).v[2];
      AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_138);
    } while (local_138.m_finished == false);
  }
  return;
}

Assistant:

void Harmonic::star_map() {
	Point center(0, 0, 0);
	for (SolidVertexIterator viter(_nmesh); !viter.end(); ++viter) {
		Solid::tVertex vertex = *viter;
		center += vertex->point();
	}
	center /= _nmesh->numVertices();
	for (SolidVertexIterator viter(_nmesh); !viter.end(); ++viter) {
		Solid::tVertex vertex = *viter;
		vertex->point() -= center;
		vertex->point() /= vertex->point().norm();
		v_n(vertex) = vertex->point();
	}
}